

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

bool __thiscall Debugger::ProcessBreakPoint(Debugger *this,shared_ptr<BreakPoint> *bp)

{
  bool bVar1;
  ulong uVar2;
  element_type *peVar3;
  element_type *peVar4;
  Variable *pVVar5;
  bool local_b1;
  shared_ptr<BreakPoint> local_70;
  shared_ptr<BreakPoint> local_60;
  shared_ptr<EvalContext> local_50;
  undefined1 local_3d;
  bool suc;
  undefined1 local_30 [8];
  shared_ptr<EvalContext> ctx;
  shared_ptr<BreakPoint> *bp_local;
  Debugger *this_local;
  
  ctx.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bp;
  std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)bp);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::make_shared<EvalContext>();
    peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )bp);
    peVar4 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    std::__cxx11::string::operator=((string *)&peVar4->expr,(string *)&peVar3->condition);
    peVar4 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    peVar4->depth = 1;
    std::shared_ptr<EvalContext>::shared_ptr(&local_50,(shared_ptr<EvalContext> *)local_30);
    bVar1 = DoEval(this,&local_50);
    std::shared_ptr<EvalContext>::~shared_ptr(&local_50);
    local_b1 = false;
    local_3d = bVar1;
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      pVVar5 = Idx<Variable>::operator->(&peVar4->result);
      local_b1 = false;
      if (pVVar5->valueType == 1) {
        peVar4 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        pVVar5 = Idx<Variable>::operator->(&peVar4->result);
        local_b1 = std::operator==(&pVVar5->value,"true");
      }
    }
    this_local._7_1_ = local_b1;
    std::shared_ptr<EvalContext>::~shared_ptr((shared_ptr<EvalContext> *)local_30);
  }
  else {
    std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)bp);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::shared_ptr<BreakPoint>::shared_ptr(&local_60,bp);
      DoLogMessage(this,&local_60);
      std::shared_ptr<BreakPoint>::~shared_ptr(&local_60);
      this_local._7_1_ = false;
    }
    else {
      std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)bp);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        peVar3 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)bp);
        peVar3->hitCount = peVar3->hitCount + 1;
        std::shared_ptr<BreakPoint>::shared_ptr(&local_70,bp);
        this_local._7_1_ = DoHitCondition(this,&local_70);
        std::shared_ptr<BreakPoint>::~shared_ptr(&local_70);
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Debugger::ProcessBreakPoint(std::shared_ptr<BreakPoint> bp) {
	if (!bp->condition.empty()) {
		auto ctx = std::make_shared<EvalContext>();
		ctx->expr = bp->condition;
		ctx->depth = 1;
		bool suc = DoEval(ctx);
		return suc && ctx->result->valueType == LUA_TBOOLEAN && ctx->result->value == "true";
	}
	if (!bp->logMessage.empty()) {
		DoLogMessage(bp);
		return false;
	}
	if (!bp->hitCondition.empty()) {
		bp->hitCount++;

		return DoHitCondition(bp);
	}
	return true;
}